

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Action<int_(int,_int,_int)> __thiscall
testing::internal::ReturnAction::operator_cast_to_Action(ReturnAction *this)

{
  Impl<int,_int_(int,_int,_int)> *this_00;
  linked_ptr_internal extraout_RDX;
  linked_ptr<int> *in_RSI;
  Action<int_(int,_int,_int)> AVar1;
  ReturnAction<int> *this_local;
  
  this_00 = (Impl<int,_int_(int,_int,_int)> *)operator_new(0x10);
  ReturnAction<int>::Impl<int,_int_(int,_int,_int)>::Impl(this_00,in_RSI);
  Action<int_(int,_int,_int)>::Action
            ((Action<int_(int,_int,_int)> *)this,(ActionInterface<int_(int,_int,_int)> *)this_00);
  AVar1.impl_.link_.next_ = extraout_RDX.next_;
  AVar1.impl_.value_ = (ActionInterface<int_(int,_int,_int)> *)this;
  return (Action<int_(int,_int,_int)>)AVar1.impl_;
}

Assistant:

operator Action<F>() const {
    // Assert statement belongs here because this is the best place to verify
    // conditions on F. It produces the clearest error messages
    // in most compilers.
    // Impl really belongs in this scope as a local class but can't
    // because MSVC produces duplicate symbols in different translation units
    // in this case. Until MS fixes that bug we put Impl into the class scope
    // and put the typedef both here (for use in assert statement) and
    // in the Impl class. But both definitions must be the same.
    typedef typename Function<F>::Result Result;
    GTEST_COMPILE_ASSERT_(
        !is_reference<Result>::value,
        use_ReturnRef_instead_of_Return_to_return_a_reference);
    return Action<F>(new Impl<R, F>(value_));
  }